

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

Geometry * rw::Geometry::streamRead(Stream *stream)

{
  Triangle *pTVar1;
  MorphTarget *pMVar2;
  bool bVar3;
  int32 iVar4;
  int32 iVar5;
  Geometry *this;
  MaterialList *pMVar6;
  long lVar7;
  long lVar8;
  uint32 version;
  uint32 tribuf [2];
  SurfaceProperties surfProps;
  GeoStreamData buf;
  uint local_58;
  uint local_54;
  uint local_50;
  undefined8 local_4c;
  undefined4 local_44;
  uint32 local_40;
  int32 local_3c;
  int32 local_38;
  int local_34;
  
  bVar3 = findChunk(stream,1,(uint32 *)0x0,&local_58);
  if (bVar3) {
    Stream::read32(stream,&local_40,0x10);
    this = create(local_38,local_3c,local_40);
    if (this != (Geometry *)0x0) {
      addMorphTargets(this,local_34 + -1);
      if (local_58 < 0x34000) {
        Stream::read32(stream,&local_4c,0xc);
      }
      if ((this->flags >> 0x18 & 1) == 0) {
        if ((this->flags & 8) != 0) {
          (*stream->_vptr_Stream[4])(stream,this->colors,(ulong)(uint)(this->numVertices << 2));
        }
        if (0 < this->numTexCoordSets) {
          lVar7 = 0;
          do {
            Stream::read32(stream,this->texCoords[lVar7],this->numVertices << 3);
            lVar7 = lVar7 + 1;
          } while (lVar7 < this->numTexCoordSets);
        }
        if (0 < this->numTriangles) {
          lVar7 = 0;
          do {
            Stream::read32(stream,&local_54,8);
            pTVar1 = this->triangles;
            *(uint *)pTVar1[lVar7].v = local_54 >> 0x10 | local_54 << 0x10;
            *(uint *)(pTVar1[lVar7].v + 2) = local_50 >> 0x10 | local_50 << 0x10;
            lVar7 = lVar7 + 1;
          } while (lVar7 < this->numTriangles);
        }
      }
      if (0 < this->numMorphTargets) {
        lVar7 = 0x20;
        lVar8 = 0;
        do {
          pMVar2 = this->morphTargets;
          Stream::read32(stream,(void *)((long)pMVar2 + lVar7 + -0x18),0x10);
          iVar4 = Stream::readI32(stream);
          iVar5 = Stream::readI32(stream);
          if (iVar4 != 0) {
            Stream::read32(stream,*(void **)((long)pMVar2 + lVar7 + -8),this->numVertices * 0xc);
          }
          if (iVar5 != 0) {
            Stream::read32(stream,*(void **)((long)&pMVar2->parent + lVar7),this->numVertices * 0xc)
            ;
          }
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 0x28;
        } while (lVar8 < this->numMorphTargets);
      }
      bVar3 = findChunk(stream,8,(uint32 *)0x0,(uint32 *)0x0);
      if (bVar3) {
        if (local_58 < 0x34000) {
          DAT_00149888 = local_44;
          defaultSurfaceProps = local_4c;
        }
        pMVar6 = MaterialList::streamRead(stream,&this->matList);
        if (local_58 < 0x34000) {
          defaultSurfaceProps = 0x3f8000003f800000;
          DAT_00149888 = 0x3f800000;
        }
        if ((pMVar6 != (MaterialList *)0x0) &&
           (bVar3 = PluginList::streamRead((PluginList *)&s_plglist,stream,this), bVar3)) {
          return this;
        }
      }
      else {
        streamRead();
      }
      destroy(this);
    }
  }
  else {
    streamRead();
  }
  return (Geometry *)0x0;
}

Assistant:

Geometry*
Geometry::streamRead(Stream *stream)
{
	uint32 version;
	GeoStreamData buf;
	SurfaceProperties surfProps;
	MaterialList *ret;
	static SurfaceProperties reset = { 1.0f, 1.0f, 1.0f };

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read32(&buf, sizeof(buf));
	Geometry *geo = Geometry::create(buf.numVertices,
	                                 buf.numTriangles, buf.flags);
	if(geo == nil)
		return nil;
	geo->addMorphTargets(buf.numMorphTargets-1);
	if(version < 0x34000)
		stream->read32(&surfProps, 12);

	if(!(geo->flags & NATIVE)){
		if(geo->flags & PRELIT)
			stream->read8(geo->colors, 4*geo->numVertices);
		for(int32 i = 0; i < geo->numTexCoordSets; i++)
			stream->read32(geo->texCoords[i],
				    2*geo->numVertices*4);
		for(int32 i = 0; i < geo->numTriangles; i++){
			uint32 tribuf[2];
			stream->read32(tribuf, 8);
			geo->triangles[i].v[0]  = tribuf[0] >> 16;
			geo->triangles[i].v[1]  = tribuf[0];
			geo->triangles[i].v[2]  = tribuf[1] >> 16;
			geo->triangles[i].matId = tribuf[1];
		}
	}

	for(int32 i = 0; i < geo->numMorphTargets; i++){
		MorphTarget *m = &geo->morphTargets[i];
		stream->read32(&m->boundingSphere, 4*4);
		int32 hasVertices = stream->readI32();
		int32 hasNormals = stream->readI32();
		if(hasVertices)
			stream->read32(m->vertices, 3*geo->numVertices*4);
		if(hasNormals)
			stream->read32(m->normals, 3*geo->numVertices*4);
	}

	if(!findChunk(stream, ID_MATLIST, nil, nil)){
		RWERROR((ERR_CHUNK, "MATLIST"));
		goto fail;
	}
	if(version < 0x34000)
		defaultSurfaceProps = surfProps;

	ret = MaterialList::streamRead(stream, &geo->matList);
	if(version < 0x34000)
		defaultSurfaceProps = reset;
	if(ret == nil)
		goto fail;
	if(s_plglist.streamRead(stream, geo))
		return geo;

fail:
	geo->destroy();
	return nil;
}